

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall Default::Action(Default *this)

{
  SymbolName SVar1;
  int iVar2;
  Statement *pSVar3;
  int local_20;
  SymbolName name;
  int state;
  int ret;
  Default *this_local;
  
  local_20 = 0;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (local_20 == 0) {
      if (SVar1 != DEFAULT_SYM) {
        return -1;
      }
      local_20 = 1;
    }
    else if (local_20 == 1) {
      if (SVar1 != COLON_SYM) {
        return -1;
      }
      local_20 = 2;
    }
    else if (local_20 == 2) {
      pSVar3 = (Statement *)operator_new(0x1e8);
      Statement::Statement(pSVar3);
      this->m_statement_ptr = pSVar3;
      iVar2 = (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[2])();
      if (iVar2 == 0) {
        (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[1])();
        pSVar3 = this->m_statement_ptr;
        if (pSVar3 != (Statement *)0x0) {
          Statement::~Statement(pSVar3);
          operator_delete(pSVar3);
        }
        this_local._4_4_ = 0;
      }
      else {
        pSVar3 = this->m_statement_ptr;
        if (pSVar3 != (Statement *)0x0) {
          Statement::~Statement(pSVar3);
          operator_delete(pSVar3);
        }
        this_local._4_4_ = -1;
      }
      return this_local._4_4_;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode Default::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == DEFAULT_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COLON_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                m_statement_ptr = new Statement;
                if ((ret = m_statement_ptr->Action()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    delete(m_statement_ptr);
                    return COMPILE_OK;
                } else {
                    delete(m_statement_ptr);
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}